

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_conversion_to_int_array_with_runoptimize(void)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  _Bool _Var6;
  uint32_t i;
  uint32_t uVar7;
  uint uVar8;
  roaring_bitmap_t *prVar9;
  uint32_t *a;
  uint64_t uVar10;
  uint32_t *ans;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  uint len;
  unsigned_long result;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  iVar14 = 0;
  prVar9 = roaring_bitmap_create_with_capacity(0);
  a = (uint32_t *)calloc(100000,4);
  uVar7 = 0;
  do {
    if (uVar7 != 30000) {
      lVar11 = (long)iVar14;
      iVar14 = iVar14 + 1;
      a[lVar11] = uVar7;
    }
    auVar4 = _DAT_00134100;
    auVar3 = _DAT_001340f0;
    auVar2 = _DAT_001340e0;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 50000);
  len = iVar14 + 0xdca;
  lVar11 = -0xea8c;
  lVar13 = 0;
  do {
    auVar16._8_4_ = (int)lVar13;
    auVar16._0_8_ = lVar13;
    auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
    auVar17 = (auVar16 | auVar3) ^ auVar4;
    iVar1 = (int)lVar11;
    if (auVar17._4_4_ == -0x80000000 && auVar17._0_4_ < -0x7ffff236) {
      a[iVar14 + lVar13] = iVar1 + 0x1fbfc;
      a[(long)iVar14 + lVar13 + 1] = iVar1 + 0x1fc0d;
    }
    auVar16 = (auVar16 | auVar2) ^ auVar4;
    if (auVar16._4_4_ == -0x80000000 && auVar16._0_4_ < -0x7ffff236) {
      a[(long)iVar14 + lVar13 + 2] = iVar1 + 0x1fc1e;
      a[(long)iVar14 + lVar13 + 3] = iVar1 + 0x1fc2f;
    }
    lVar13 = lVar13 + 4;
    lVar11 = lVar11 + 0x44;
  } while (lVar11 != 0);
  uVar8 = 0x30000;
  do {
    if ((uVar8 / 3) * 3 != uVar8) {
      lVar11 = (long)(int)len;
      len = len + 1;
      a[lVar11] = uVar8;
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x40000);
  roaring_bitmap_free(prVar9);
  prVar9 = make_roaring_from_array(a,len);
  _Var6 = roaring_bitmap_run_optimize(prVar9);
  _assert_true((ulong)_Var6,"roaring_bitmap_run_optimize(r1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xa8e);
  uVar10 = roaring_bitmap_get_cardinality(prVar9);
  ans = (uint32_t *)malloc(uVar10 * 4);
  roaring_bitmap_to_uint32_array(prVar9,ans);
  if (len == (uint)uVar10) {
    if ((int)len < 1) {
      result = 1;
      goto LAB_0010dedf;
    }
    if (*ans == *a) {
      uVar15 = (ulong)((uint)uVar10 & 0x7fffffff);
      uVar5 = 1;
      do {
        uVar12 = uVar5;
        if (uVar15 == uVar12) break;
        uVar5 = uVar12 + 1;
      } while (ans[uVar12] == a[uVar12]);
      result = (unsigned_long)(uVar15 <= uVar12);
      goto LAB_0010dedf;
    }
  }
  result = 0;
LAB_0010dedf:
  _assert_true(result,"array_equals(arr, (int)card, ans, ans_ctr)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xa94);
  roaring_bitmap_free(prVar9);
  free(ans);
  free(a);
  return;
}

Assistant:

DEFINE_TEST(test_conversion_to_int_array_with_runoptimize) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    int ans_ctr = 0;
    uint32_t *ans = (uint32_t *)calloc(100000, sizeof(int32_t));

    // a dense bitmap container  (best done with runs)
    for (uint32_t i = 0; i < 50000; ++i) {
        if (i != 30000) {  // making 2 runs
            ans[ans_ctr++] = i;
        }
    }

    // a sparse one
    for (uint32_t i = 70000; i < 130000; i += 17) {
        ans[ans_ctr++] = i;
    }

    // a dense one but not good for runs

    for (uint32_t i = 65536 * 3; i < 65536 * 4; i++) {
        if (i % 3 != 0) {
            ans[ans_ctr++] = i;
        }
    }
    roaring_bitmap_free(r1);

    r1 = make_roaring_from_array(ans, ans_ctr);
    assert_true(roaring_bitmap_run_optimize(r1));

    uint64_t card = roaring_bitmap_get_cardinality(r1);
    uint32_t *arr = (uint32_t *)malloc(card * sizeof(uint32_t));
    roaring_bitmap_to_uint32_array(r1, arr);

    assert_true(array_equals(arr, (int)card, ans, ans_ctr));
    roaring_bitmap_free(r1);
    free(arr);
    free(ans);
}